

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

Error __thiscall llvm::sys::fs::TempFile::keep(TempFile *this)

{
  int iVar1;
  int *piVar2;
  size_t in_RDX;
  char *in_RSI;
  StringRef Filename;
  error_code EC;
  
  if (*in_RSI != '\x01') {
    *in_RSI = '\x01';
    Filename.Length = in_RDX;
    Filename.Data = *(char **)(in_RSI + 0x10);
    DontRemoveFileOnSignal(*(sys **)(in_RSI + 8),Filename);
    std::__cxx11::string::_M_replace((ulong)(in_RSI + 8),0,*(char **)(in_RSI + 0x10),0x196a1b);
    iVar1 = close(*(int *)(in_RSI + 0x28));
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      iVar1 = *piVar2;
      std::_V2::generic_category();
      EC._M_cat._0_4_ = iVar1;
      EC._0_8_ = this;
      EC._M_cat._4_4_ = 0;
      errorCodeToError(EC);
    }
    else {
      in_RSI[0x28] = -1;
      in_RSI[0x29] = -1;
      in_RSI[0x2a] = -1;
      in_RSI[0x2b] = -1;
      *(undefined8 *)this = 1;
    }
    return (Error)(ErrorInfoBase *)this;
  }
  __assert_fail("!Done",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Path.cpp"
                ,0x49f,"Error llvm::sys::fs::TempFile::keep()");
}

Assistant:

Error TempFile::keep() {
  assert(!Done);
  Done = true;

#ifdef _WIN32
  auto H = reinterpret_cast<HANDLE>(_get_osfhandle(FD));
  if (std::error_code EC = setDeleteDisposition(H, false))
    return errorCodeToError(EC);
#else
  sys::DontRemoveFileOnSignal(TmpName);
#endif

  TmpName = "";

  if (close(FD) == -1) {
    std::error_code EC(errno, std::generic_category());
    return errorCodeToError(EC);
  }
  FD = -1;

  return Error::success();
}